

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlantUmlGenerator.cpp
# Opt level: O2

void __thiscall PlantUmlGenerator::endState(PlantUmlGenerator *this,ostream *output,string *indent)

{
  ostream *poVar1;
  
  std::__cxx11::string::erase((ulong)indent,indent->_M_string_length - 2);
  poVar1 = std::operator<<(output,(string *)indent);
  std::operator<<(poVar1,"}\n");
  return;
}

Assistant:

void PlantUmlGenerator::endState(std::ostream &output, std::string &indent)
{
    indent.erase(indent.size() - 2);
    output << indent << "}\n";
}